

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

void Glucose_QuantifyAigTest(Gia_Man_t *p)

{
  bmcg_sat_solver *pbVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Gia_Obj_t *pGVar6;
  abctime aVar7;
  abctime aVar8;
  abctime aVar9;
  abctime clk2d;
  int iRes2;
  abctime clk2;
  abctime clk1d;
  int iRes1;
  abctime clk1;
  bmcg_sat_solver *pSats [3];
  Gia_Man_t *p_local;
  
  pSats[2] = p;
  clk1 = (abctime)bmcg_sat_solver_start();
  pSats[0] = bmcg_sat_solver_start();
  pSats[1] = bmcg_sat_solver_start();
  aVar5 = Abc_Clock();
  pbVar1 = pSats[2];
  pGVar6 = Gia_ManPo((Gia_Man_t *)pSats[2],0);
  iVar2 = Gia_ObjFaninLit0p((Gia_Man_t *)pbVar1,pGVar6);
  iVar2 = bmcg_sat_solver_quantify
                    ((bmcg_sat_solver **)&clk1,(Gia_Man_t *)pbVar1,iVar2,0,Gia_ManCiIsToKeep,
                     (void *)0x0,(Vec_Int_t *)0x0);
  aVar7 = Abc_Clock();
  aVar8 = Abc_Clock();
  pbVar1 = pSats[2];
  pGVar6 = Gia_ManPo((Gia_Man_t *)pSats[2],0);
  iVar3 = Gia_ObjFaninLit0p((Gia_Man_t *)pbVar1,pGVar6);
  iVar3 = bmcg_sat_solver_quantify2
                    ((Gia_Man_t *)pbVar1,iVar3,0,Gia_ManCiIsToKeep,(void *)0x0,(Vec_Int_t *)0x0);
  aVar9 = Abc_Clock();
  Abc_PrintTime(1,"Time1",aVar7 - aVar5);
  Abc_PrintTime(1,"Time2",aVar9 - aVar8);
  iVar4 = bmcg_sat_solver_equiv_overlap_check(pSats[1],(Gia_Man_t *)pSats[2],iVar2,iVar3,1);
  if (iVar4 == 0) {
    printf("Verification FAILED.\n");
  }
  else {
    printf("Verification passed.\n");
  }
  Gia_ManAppendCo((Gia_Man_t *)pSats[2],iVar2);
  Gia_ManAppendCo((Gia_Man_t *)pSats[2],iVar3);
  bmcg_sat_solver_stop((bmcg_sat_solver *)clk1);
  bmcg_sat_solver_stop(pSats[0]);
  bmcg_sat_solver_stop(pSats[1]);
  return;
}

Assistant:

void Glucose_QuantifyAigTest( Gia_Man_t * p )
{
    bmcg_sat_solver * pSats[3] = { bmcg_sat_solver_start(), bmcg_sat_solver_start(), bmcg_sat_solver_start() };

    abctime clk1 = Abc_Clock();
    int iRes1 = bmcg_sat_solver_quantify( pSats, p, Gia_ObjFaninLit0p(p, Gia_ManPo(p, 0)), 0, Gia_ManCiIsToKeep, NULL, NULL );
    abctime clk1d = Abc_Clock()-clk1;

    abctime clk2 = Abc_Clock();
    int iRes2 = bmcg_sat_solver_quantify2( p, Gia_ObjFaninLit0p(p, Gia_ManPo(p, 0)), 0, Gia_ManCiIsToKeep, NULL, NULL );
    abctime clk2d = Abc_Clock()-clk2;

    Abc_PrintTime( 1, "Time1", clk1d );
    Abc_PrintTime( 1, "Time2", clk2d );

    if ( bmcg_sat_solver_equiv_overlap_check( pSats[2], p, iRes1, iRes2, 1 ) )
        printf( "Verification passed.\n" );
    else
        printf( "Verification FAILED.\n" );

    Gia_ManAppendCo( p, iRes1 );
    Gia_ManAppendCo( p, iRes2 );

    bmcg_sat_solver_stop( pSats[0] );
    bmcg_sat_solver_stop( pSats[1] );
    bmcg_sat_solver_stop( pSats[2] );
}